

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# milo.c
# Opt level: O1

void * milo_context_push(milo_context *c,size_t size)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  ulong __size;
  
  if (size != 0) {
    uVar2 = c->top + size;
    if (c->size <= uVar2) {
      if (c->size == 0) {
        c->size = 0x100;
      }
      __size = c->size;
      if (__size <= uVar2) {
        do {
          __size = (__size >> 1) + __size;
        } while (__size <= uVar2);
        c->size = __size;
      }
      pcVar3 = (char *)realloc(c->stack,__size);
      c->stack = pcVar3;
    }
    sVar1 = c->top;
    c->top = size + sVar1;
    return c->stack + sVar1;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/milo.c",
                0x1f,"void *milo_context_push(milo_context *, size_t)");
}

Assistant:

static void* milo_context_push(milo_context* c, size_t size) {
    void* ret;
    assert(size > 0);
    if (c->top + size >= c->size) {
        if (c->size == 0)
            c->size = MILO_PARSE_STACK_INIT_SIZE;
        while (c->top + size >= c->size)
            c->size += c->size >> 1; /* c->size * 1.5 */
        c->stack = (char*) realloc(c->stack, c->size);
    }
    ret = c->stack + c->top;
    c->top += size;
    return ret;
}